

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

bool despot::util::tinyxml::TiXmlBase::StringEqual
               (char *p,char *tag,bool ignoreCase,TiXmlEncoding encoding)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char *local_30;
  char *q;
  TiXmlEncoding encoding_local;
  bool ignoreCase_local;
  char *tag_local;
  char *p_local;
  
  if (p == (char *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0x1ef,
                  "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
                 );
  }
  if (tag != (char *)0x0) {
    if ((p == (char *)0x0) || (*p == '\0')) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0x1f2,
                    "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
                   );
    }
    local_30 = p;
    _encoding_local = tag;
    if (ignoreCase) {
      while( true ) {
        bVar3 = false;
        if ((*local_30 != '\0') && (bVar3 = false, *_encoding_local != '\0')) {
          iVar1 = ToLower((int)*local_30,encoding);
          iVar2 = ToLower((int)*_encoding_local,encoding);
          bVar3 = iVar1 == iVar2;
        }
        if (!bVar3) break;
        local_30 = local_30 + 1;
        _encoding_local = _encoding_local + 1;
      }
      if (*_encoding_local == '\0') {
        return true;
      }
    }
    else {
      while( true ) {
        bVar3 = false;
        if ((*local_30 != '\0') && (bVar3 = false, *_encoding_local != '\0')) {
          bVar3 = *local_30 == *_encoding_local;
        }
        if (!bVar3) break;
        local_30 = local_30 + 1;
        _encoding_local = _encoding_local + 1;
      }
      if (*_encoding_local == '\0') {
        return true;
      }
    }
    return false;
  }
  __assert_fail("tag",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                ,0x1f0,
                "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
               );
}

Assistant:

bool TiXmlBase::StringEqual(const char* p, const char* tag, bool ignoreCase,
	TiXmlEncoding encoding) {
	assert(p);
	assert(tag);
	if (!p || !*p) {
		assert(0);
		return false;
	}

	const char* q = p;

	if (ignoreCase) {
		while (*q && *tag && ToLower(*q, encoding) == ToLower(*tag, encoding)) {
			++q;
			++tag;
		}

		if (*tag == 0)
			return true;
	} else {
		while (*q && *tag && *q == *tag) {
			++q;
			++tag;
		}

		if (*tag == 0) // Have we found the end of the tag, and everything equal?
			return true;
	}
	return false;
}